

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botp.c
# Opt level: O3

void botpTimeToCtr(octet *ctr,tm_time_t t)

{
  tm_time_t local_18;
  
  local_18 = t;
  memSet(ctr,'\0',0);
  memCopy(ctr,&local_18,8);
  memRev(ctr,8);
  return;
}

Assistant:

static void botpTimeToCtr(octet ctr[8], tm_time_t t)
{
	ASSERT(sizeof(t) <= 8);
	memSetZero(ctr, 8 - sizeof(t));
	memCopy(ctr + 8 - sizeof(t), &t, sizeof(t));
#if (OCTET_ORDER == LITTLE_ENDIAN)
	memRev(ctr + 8 - sizeof(t), sizeof(t));
#endif
}